

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtcnn.cpp
# Opt level: O2

void __thiscall Pnet::~Pnet(Pnet *this)

{
  freepBox(this->rgb);
  freepBox(this->conv1);
  freepBox(this->maxPooling1);
  freepBox(this->conv2);
  freepBox(this->conv3);
  freepBox(this->score_);
  freepBox(this->location_);
  freeWeight(this->conv1_wb);
  freepRelu(this->prelu_gmma1);
  freeWeight(this->conv2_wb);
  freepRelu(this->prelu_gmma2);
  freeWeight(this->conv3_wb);
  freepRelu(this->prelu_gmma3);
  freeWeight(this->conv4c1_wb);
  freeWeight(this->conv4c2_wb);
  std::_Vector_base<orderScore,_std::allocator<orderScore>_>::~_Vector_base
            (&(this->bboxScore_).super__Vector_base<orderScore,_std::allocator<orderScore>_>);
  std::_Vector_base<Bbox,_std::allocator<Bbox>_>::~_Vector_base
            (&(this->boundingBox_).super__Vector_base<Bbox,_std::allocator<Bbox>_>);
  return;
}

Assistant:

Pnet::~Pnet() {
    freepBox(this->rgb);
    freepBox(this->conv1);
    freepBox(this->maxPooling1);
    freepBox(this->conv2);
    freepBox(this->conv3);
    freepBox(this->score_);
    freepBox(this->location_);

    freeWeight(this->conv1_wb);
    freepRelu(this->prelu_gmma1);
    freeWeight(this->conv2_wb);
    freepRelu(this->prelu_gmma2);
    freeWeight(this->conv3_wb);
    freepRelu(this->prelu_gmma3);
    freeWeight(this->conv4c1_wb);
    freeWeight(this->conv4c2_wb);
}